

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void __thiscall ByteCodeGenerator::FinalizeFuncInfos(ByteCodeGenerator *this)

{
  Type TVar1;
  ParseableFunctionInfo *pPVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Type *ppFVar6;
  FunctionInfo *pFVar7;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *pSVar8;
  Iterator local_40;
  
  pSVar8 = this->funcInfosToFinalize;
  if (pSVar8 != (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    local_40.list = &pSVar8->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>;
    local_40.current = (NodeBase *)pSVar8;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    while( true ) {
      if (pSVar8 == (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) goto LAB_00820943;
        *puVar5 = 0;
        pSVar8 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      }
      local_40.current =
           (pSVar8->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
           super_SListNodeBase<Memory::ArenaAllocator>.next;
      if ((SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
          local_40.list) break;
      ppFVar6 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
      pSVar8 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      if (((*ppFVar6)->field_0xb4 & 1) != 0) {
        pPVar2 = (*ppFVar6)->byteCodeFunction;
        pFVar7 = (pPVar2->super_FunctionProxy).functionInfo.ptr;
        if (pFVar7 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x545,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar4) goto LAB_00820943;
          *puVar5 = 0;
          pFVar7 = (pPVar2->super_FunctionProxy).functionInfo.ptr;
        }
        if ((ParseableFunctionInfo *)(pFVar7->functionBodyImpl).ptr != pPVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                             "GetFunctionInfo()->GetFunctionProxy() == this");
          if (!bVar4) goto LAB_00820943;
          *puVar5 = 0;
          pFVar7 = (pPVar2->super_FunctionProxy).functionInfo.ptr;
        }
        TVar1 = pFVar7->attributes;
        if ((ParseableFunctionInfo *)(pFVar7->functionBodyImpl).ptr != pPVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x54d,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                             "GetFunctionInfo()->GetFunctionProxy() == this");
          if (!bVar4) {
LAB_00820943:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar5 = 0;
          pFVar7 = (pPVar2->super_FunctionProxy).functionInfo.ptr;
        }
        pFVar7->attributes = TVar1 | CanDefer;
        pSVar8 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      }
    }
    this->funcInfosToFinalize = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  }
  return;
}

Assistant:

void ByteCodeGenerator::FinalizeFuncInfos()
{
    if (this->funcInfosToFinalize == nullptr)
    {
        return;
    }

    FOREACH_SLIST_ENTRY(FuncInfo*, funcInfo, this->funcInfosToFinalize)
    {
        if (funcInfo->canDefer)
        {
            funcInfo->byteCodeFunction->SetAttributes((Js::FunctionInfo::Attributes)(funcInfo->byteCodeFunction->GetAttributes() | Js::FunctionInfo::Attributes::CanDefer));
        }
    }
    NEXT_SLIST_ENTRY;

    this->funcInfosToFinalize = nullptr;
}